

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_cache.hpp
# Opt level: O3

shared_ptr<duckdb::ParquetFileMetadataCache,_true> __thiscall
duckdb::ObjectCache::Get<duckdb::ParquetFileMetadataCache>(ObjectCache *this,string *key)

{
  int iVar1;
  ObjectCacheEntry *pOVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **__s2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  bool bVar4;
  shared_ptr<duckdb::ObjectCacheEntry,_true> sVar5;
  shared_ptr<duckdb::ParquetFileMetadataCache,_true> sVar6;
  shared_ptr<duckdb::ObjectCacheEntry,_true> object;
  size_type __dnew;
  undefined1 local_88 [16];
  shared_ptr<duckdb::ObjectCacheEntry,_true> local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58 [2];
  undefined8 local_48;
  undefined8 local_40 [2];
  undefined1 local_30 [16];
  
  sVar5 = GetObject((ObjectCache *)local_88,key);
  _Var3._M_pi = sVar5.internal.
                super___shared_ptr<duckdb::ObjectCacheEntry,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi;
  if ((element_type *)local_88._0_8_ != (element_type *)0x0) {
    pOVar2 = shared_ptr<duckdb::ObjectCacheEntry,_true>::operator->
                       ((shared_ptr<duckdb::ObjectCacheEntry,_true> *)local_88);
    (*pOVar2->_vptr_ObjectCacheEntry[2])(local_40,pOVar2);
    local_48 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x10;
    local_68 = local_58;
    __s2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
           std::__cxx11::string::_M_create((ulong *)&local_68,(ulong)&local_48);
    local_58[0] = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48;
    *__s2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x5f74657571726170;
    __s2[1] = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x617461646174656d;
    local_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48;
    *(char *)((long)__s2 + local_48) = '\0';
    _Var3._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40[1];
    local_68 = __s2;
    if (local_40[1] == local_48) {
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40[1] ==
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        bVar4 = false;
      }
      else {
        iVar1 = bcmp((void *)local_40[0],__s2,local_40[1]);
        bVar4 = iVar1 != 0;
        _Var3._M_pi = extraout_RDX;
      }
    }
    else {
      bVar4 = true;
    }
    if (__s2 != local_58) {
      operator_delete(__s2);
      _Var3._M_pi = extraout_RDX_00;
    }
    if ((undefined1 *)local_40[0] != local_30) {
      operator_delete((void *)local_40[0]);
      _Var3._M_pi = extraout_RDX_01;
    }
    if (!bVar4) {
      local_78.internal.super___shared_ptr<duckdb::ObjectCacheEntry,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)local_88._0_8_;
      local_78.internal.super___shared_ptr<duckdb::ObjectCacheEntry,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(local_88._8_8_ + 8) = *(_Atomic_word *)(local_88._8_8_ + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(local_88._8_8_ + 8) = *(_Atomic_word *)(local_88._8_8_ + 8) + 1;
        }
      }
      sVar6 = shared_ptr_cast<duckdb::ObjectCacheEntry,duckdb::ParquetFileMetadataCache>
                        ((duckdb *)this,&local_78);
      _Var3._M_pi = sVar6.internal.
                    super___shared_ptr<duckdb::ParquetFileMetadataCache,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
      if (local_78.internal.super___shared_ptr<duckdb::ObjectCacheEntry,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_78.internal.
                   super___shared_ptr<duckdb::ObjectCacheEntry,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
        _Var3._M_pi = extraout_RDX_02;
      }
      goto LAB_002ab7f5;
    }
  }
  *(undefined8 *)this = 0;
  *(undefined8 *)&this->field_0x8 = 0;
LAB_002ab7f5:
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
    _Var3._M_pi = extraout_RDX_03;
  }
  sVar6.internal.super___shared_ptr<duckdb::ParquetFileMetadataCache,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var3._M_pi;
  sVar6.internal.super___shared_ptr<duckdb::ParquetFileMetadataCache,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (shared_ptr<duckdb::ParquetFileMetadataCache,_true>)
         sVar6.internal.
         super___shared_ptr<duckdb::ParquetFileMetadataCache,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<T> Get(const string &key) {
		shared_ptr<ObjectCacheEntry> object = GetObject(key);
		if (!object || object->GetObjectType() != T::ObjectType()) {
			return nullptr;
		}
		return shared_ptr_cast<ObjectCacheEntry, T>(object);
	}